

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<char,_8U>::SmallVector(SmallVector<char,_8U> *this,SmallVector<char,_8U> *RHS)

{
  (this->super_SmallVectorImpl<char>).super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
       &this->super_SmallVectorStorage<char,_8U>;
  (this->super_SmallVectorImpl<char>).super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
  (this->super_SmallVectorImpl<char>).super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 8;
  if ((RHS->super_SmallVectorImpl<char>).super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0) {
    SmallVectorImpl<char>::operator=
              (&this->super_SmallVectorImpl<char>,&RHS->super_SmallVectorImpl<char>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }